

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

size_t nlohmann::detail::
       serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       ::extra_space(string_t *s,bool ensure_ascii)

{
  ulong uVar1;
  undefined1 *puVar2;
  char *pcVar3;
  uint8_t *puVar4;
  size_t sVar5;
  long lVar6;
  size_t bytes;
  size_t i;
  size_t res;
  bool ensure_ascii_local;
  string_t *s_local;
  
  i = 0;
  bytes = 0;
  do {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= bytes) {
      return i;
    }
    puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)s);
    switch(*puVar2) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xb:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
      i = i + 5;
      break;
    case 8:
    case 9:
    case 10:
    case 0xc:
    case 0xd:
    case 0x22:
    case 0x5c:
      i = i + 1;
      break;
    default:
      if ((ensure_ascii) &&
         ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), ((int)*pcVar3 & 0x80U) != 0
          || (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == '\x7f')))) {
        puVar4 = (uint8_t *)std::__cxx11::string::operator[]((ulong)s);
        sVar5 = bytes_following(*puVar4);
        if (sVar5 == 0xffffffffffffffff) {
          __assert_fail("bytes != std::string::npos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                        ,0x18f8,
                        "static std::size_t nlohmann::detail::serializer<nlohmann::basic_json<>>::extra_space(const string_t &, const bool) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if (sVar5 == 3) {
          lVar6 = 8;
        }
        else {
          lVar6 = 5 - sVar5;
        }
        i = lVar6 + i;
        bytes = sVar5 + bytes;
      }
    }
    bytes = bytes + 1;
  } while( true );
}

Assistant:

static std::size_t extra_space(const string_t& s,
                                   const bool ensure_ascii) noexcept
    {
        std::size_t res = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            switch (s[i])
            {
                // control characters that can be escaped with a backslash
                case '"':
                case '\\':
                case '\b':
                case '\f':
                case '\n':
                case '\r':
                case '\t':
                {
                    // from c (1 byte) to \x (2 bytes)
                    res += 1;
                    break;
                }

                // control characters that need \uxxxx escaping
                case 0x00:
                case 0x01:
                case 0x02:
                case 0x03:
                case 0x04:
                case 0x05:
                case 0x06:
                case 0x07:
                case 0x0B:
                case 0x0E:
                case 0x0F:
                case 0x10:
                case 0x11:
                case 0x12:
                case 0x13:
                case 0x14:
                case 0x15:
                case 0x16:
                case 0x17:
                case 0x18:
                case 0x19:
                case 0x1A:
                case 0x1B:
                case 0x1C:
                case 0x1D:
                case 0x1E:
                case 0x1F:
                {
                    // from c (1 byte) to \uxxxx (6 bytes)
                    res += 5;
                    break;
                }

                default:
                {
                    if (ensure_ascii and (s[i] & 0x80 or s[i] == 0x7F))
                    {
                        const auto bytes = bytes_following(static_cast<uint8_t>(s[i]));
                        // invalid characters will be detected by throw_if_invalid_utf8
                        assert (bytes != std::string::npos);

                        if (bytes == 3)
                        {
                            // codepoints that need 4 bytes (i.e., 3 additional
                            // bytes) in UTF-8 need a surrogate pair when \u
                            // escaping is used: from 4 bytes to \uxxxx\uxxxx
                            // (12 bytes)
                            res += (12 - bytes - 1);
                        }
                        else
                        {
                            // from x bytes to \uxxxx (6 bytes)
                            res += (6 - bytes - 1);
                        }

                        // skip the additional bytes
                        i += bytes;
                    }
                    break;
                }
            }
        }

        return res;
    }